

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall QList<QPersistentModelIndex>::pop_back(QList<QPersistentModelIndex> *this)

{
  removeLast(this);
  return;
}

Assistant:

void pop_back() noexcept { removeLast(); }